

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512_gemm.h
# Opt level: O2

void intgemm::AVX512BW::Kernels8::QuantizeThread
               (float *input,int8_t *output,float quant_mult,size_t count)

{
  size_t i;
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 in_register_00001204 [60];
  
  auVar3._4_60_ = in_register_00001204;
  auVar3._0_4_ = quant_mult;
  auVar3 = vbroadcastss_avx512f(auVar3._0_16_);
  uVar1 = 0;
  auVar4 = vpbroadcastd_avx512f(ZEXT416(0xffffff81));
  for (; uVar1 < count; uVar1 = uVar1 + 0x10) {
    auVar5 = vmulps_avx512f(auVar3,*(undefined1 (*) [64])(input + uVar1));
    auVar5 = vcvtps2dq_avx512f(auVar5);
    auVar5 = vpmaxsd_avx512f(auVar5,auVar4);
    auVar2 = vpmovsdb_avx512f(auVar5);
    *(undefined1 (*) [16])(output + uVar1) = auVar2;
  }
  return;
}

Assistant:

INTGEMM_AVX512BW static void QuantizeThread(const float *input, int8_t *output, float quant_mult, std::size_t count) {
    const __m512i neg127 = _mm512_set1_epi32(-127);
    const __m512 quant_mult_reg = _mm512_set1_ps(quant_mult);
    const std::size_t kBatch = sizeof(__m512i) / sizeof(float);
#pragma omp for
    for (std::size_t i = 0; i < count; i += kBatch) {
      __m512i asint = QuantizerGrab(input + i, quant_mult_reg);
      asint = _mm512_max_epi32(asint, neg127);
      // There doesn't seem to be an unmasked version.
      _mm512_mask_cvtsepi32_storeu_epi8(output + i, 0xffff, asint);
    }
  }